

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O0

bool __thiscall crnlib::dds_comp::compress_init(dds_comp *this,crn_comp_params *params)

{
  bool bVar1;
  uint uVar2;
  pixel_format pVar3;
  bool hierarchical;
  crn_comp_params *params_local;
  dds_comp *this_local;
  
  clear(this);
  this->m_pParams = params;
  uVar2 = math::minimum<unsigned_int>(this->m_pParams->m_width,this->m_pParams->m_height);
  if ((uVar2 == 0) ||
     (uVar2 = math::maximum<unsigned_int>(this->m_pParams->m_width,this->m_pParams->m_height),
     0x1000 < uVar2)) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = math::minimum<unsigned_int>(this->m_pParams->m_faces,this->m_pParams->m_levels);
    if (uVar2 == 0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = create_dds_tex(this,&this->m_src_tex);
      if (bVar1) {
        dxt_image::pack_params::init(&this->m_pack_params,(EVP_PKEY_CTX *)this->m_pParams);
        if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
          (this->m_pack_params).m_pProgress_callback = progress_callback_func;
          (this->m_pack_params).m_pProgress_callback_user_data_ptr = params;
        }
        pVar3 = pixel_format_helpers::convert_crn_format_to_pixel_format(this->m_pParams->m_format);
        this->m_pixel_fmt = pVar3;
        if (this->m_pixel_fmt == PIXEL_FMT_INVALID) {
          this_local._7_1_ = false;
        }
        else {
          if ((((this->m_pixel_fmt == PIXEL_FMT_DXT1) &&
               (bVar1 = mipmapped_texture::has_alpha(&this->m_src_tex), bVar1)) &&
              (((this->m_pack_params).m_use_both_block_types & 1U) != 0)) &&
             ((this->m_pParams->m_flags & 0x80) != 0)) {
            this->m_pixel_fmt = PIXEL_FMT_DXT1A;
          }
          uVar2 = task_pool::init(&this->m_task_pool,
                                  (EVP_PKEY_CTX *)(ulong)this->m_pParams->m_num_helper_threads);
          if ((uVar2 & 1) == 0) {
            this_local._7_1_ = false;
          }
          else {
            (this->m_pack_params).m_pTask_pool = &this->m_task_pool;
            qdxt1_params::init(&this->m_q1_params,(EVP_PKEY_CTX *)&this->m_pack_params);
            qdxt5_params::init(&this->m_q5_params,(EVP_PKEY_CTX *)&this->m_pack_params);
            this_local._7_1_ = true;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool dds_comp::compress_init(const crn_comp_params& params)
    {
        clear();

        m_pParams = &params;

        if ((math::minimum(m_pParams->m_width, m_pParams->m_height) < 1) || (math::maximum(m_pParams->m_width, m_pParams->m_height) > cCRNMaxLevelResolution))
        {
            return false;
        }

        if (math::minimum(m_pParams->m_faces, m_pParams->m_levels) < 1)
        {
            return false;
        }

        if (!create_dds_tex(m_src_tex))
        {
            return false;
        }

        m_pack_params.init(*m_pParams);
        if (params.m_pProgress_func)
        {
            m_pack_params.m_pProgress_callback = progress_callback_func;
            m_pack_params.m_pProgress_callback_user_data_ptr = (void*)&params;
        }

        m_pixel_fmt = pixel_format_helpers::convert_crn_format_to_pixel_format(static_cast<crn_format>(m_pParams->m_format));
        if (m_pixel_fmt == PIXEL_FMT_INVALID)
        {
            return false;
        }
        if ((m_pixel_fmt == PIXEL_FMT_DXT1) && (m_src_tex.has_alpha()) && (m_pack_params.m_use_both_block_types) && (m_pParams->m_flags & cCRNCompFlagDXT1AForTransparency))
        {
            m_pixel_fmt = PIXEL_FMT_DXT1A;
        }

        if (!m_task_pool.init(m_pParams->m_num_helper_threads))
        {
            return false;
        }
        m_pack_params.m_pTask_pool = &m_task_pool;

        const bool hierarchical = (params.m_flags & cCRNCompFlagHierarchical) != 0;
        m_q1_params.init(m_pack_params, params.m_quality_level, hierarchical);
        m_q5_params.init(m_pack_params, params.m_quality_level, hierarchical);

        return true;
    }